

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O0

void __thiscall
ExtPubkey_FromKeyDataTest_Test::~ExtPubkey_FromKeyDataTest_Test
          (ExtPubkey_FromKeyDataTest_Test *this)

{
  ExtPubkey_FromKeyDataTest_Test *this_local;
  
  ~ExtPubkey_FromKeyDataTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ExtPubkey, FromKeyDataTest) {
  // tpubDDNapBCUaChXpE91grWNGp8xWg84GcS1iRSR7iynAFTv6JAGnKTEUB3vkHtsV4NbkZf6SfjYM6PvW3kZ77KLUZ2GTYNBN4PJRWCKN1ERjJe
  // 44
  std::string ext_base58 = "tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua";
  ExtPubkey extkey = ExtPubkey(NetType::kTestnet,
      Pubkey("02ca30dbb25a2cf96344a04ae2144fb28a17f006c34cfb973b9f21623db27c5cd3"),
      Pubkey("03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3"),
      ByteData256("839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e"),
      uint8_t{4}, uint32_t{44});

  EXPECT_STREQ("043587cf04a53a8ff30000002c839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", extkey.GetData().GetHex().c_str());
  EXPECT_STREQ("043587cf", extkey.GetVersionData().GetHex().c_str());
  EXPECT_EQ(extpubkey_kVersionTestnetPubkey, extkey.GetVersion());
  EXPECT_EQ(0xA53A8FF3, extkey.GetFingerprint());
  EXPECT_STREQ("a53a8ff3", extkey.GetFingerprintData().GetHex().c_str());
  EXPECT_TRUE(extkey.IsValid());
  EXPECT_STREQ(ext_base58.c_str(), extkey.ToString().c_str());
  EXPECT_EQ(4, extkey.GetDepth());
  EXPECT_EQ(44, extkey.GetChildNum());
  EXPECT_STREQ("839fb0d66f1887db167cdc530ab98e871d8b017ebcb198568874b6c98516364e", extkey.GetChainCode().GetHex().c_str());
  EXPECT_STREQ("03f1e767c0555ce0105b2a76d0f8b19b6d33a147f82f75a05c4c09580c39694fd3", extkey.GetPubkey().GetHex().c_str());
}